

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O1

void __thiscall
CTB<TTA>::PerformLabelingMem
          (CTB<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  ulong uVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer piVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  undefined4 uVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  double dVar28;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2b8 [104];
  Mat local_250 [16];
  long local_240;
  long *local_208;
  long local_1f0;
  undefined1 local_1e8 [104];
  Mat local_180 [16];
  long local_170;
  long *local_138;
  CTB<TTA> *local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1e8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar23 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar23 << 0x20 | uVar23 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2b8,&local_110,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar6->field_0x8;
  iVar21 = *(int *)&pMVar6->field_0xc;
  local_118 = accesses;
  TTA::MemAlloc(((iVar21 - (iVar21 + 1 >> 0x1f)) + 1 >> 1) *
                ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar23 = (ulong)*(int *)&pMVar6->field_0x8;
  local_120 = this;
  if (0 < (long)uVar23) {
    iVar4 = *(int *)&pMVar6->field_0xc;
    lVar19 = (long)iVar4;
    uVar16 = 0;
    do {
      if (0 < iVar4) {
        uVar1 = uVar16 - 1;
        uVar15 = uVar16 | 1;
        uVar24 = 0xffffffff;
        lVar26 = 0;
        iVar21 = -1;
        do {
          uVar14 = uVar1;
          switch(uVar24) {
          case 1:
            lVar13 = *local_138;
            piVar2 = (int *)(lVar13 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar20 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar26 + lVar20 * uVar16 + local_1e8._24_8_) == '\0') {
              uVar24 = 1;
              if ((uVar15 < uVar23) &&
                 (piVar2 = (int *)(local_170 + lVar13 * uVar15 + lVar26 * 4), *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + local_1e8._24_8_ + lVar20 * uVar15) != '\0')) {
                uVar10 = TTA::MemNewLabel();
                piVar2 = (int *)(*local_208 * uVar15 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_;
                uVar24 = 3;
                goto LAB_001ae9c2;
              }
            }
            else {
              if (uVar16 == 0) {
LAB_001adf52:
                if ((lVar26 == 0 || uVar16 == 0) ||
                   (piVar2 = (int *)(local_170 + lVar13 * uVar1 + -4 + lVar26 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar26 + -1 + local_1e8._24_8_ + lVar20 * uVar1) == '\0')) {
                  uVar10 = TTA::MemNewLabel();
                  piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4) =
                       uVar10;
                }
                else {
                  lVar13 = *local_208;
                  piVar2 = (int *)(lVar13 * uVar1 + local_240 + -4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar20 = *(long *)local_2b8._80_8_;
                  uVar24 = *(undefined4 *)(lVar20 * uVar1 + local_2b8._24_8_ + -4 + lVar26 * 4);
                  piVar2 = (int *)(lVar13 * uVar16 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(undefined4 *)(lVar20 * uVar16 + local_2b8._24_8_ + lVar26 * 4) = uVar24;
                }
                iVar21 = 6;
              }
              else {
                lVar25 = lVar13 * uVar1 + local_170;
                piVar2 = (int *)(lVar25 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar18 = lVar20 * uVar1 + local_1e8._24_8_;
                if (*(char *)(lVar26 + lVar18) == '\0') {
                  if ((lVar19 <= lVar26 + 1) ||
                     (piVar2 = (int *)(lVar25 + 4 + lVar26 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar18 + 1 + lVar26) == '\0')) goto LAB_001adf52;
                  lVar13 = *local_208;
                  lVar17 = lVar13 * uVar1 + local_240;
                  piVar2 = (int *)(lVar17 + 4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar20 = *(long *)local_2b8._80_8_;
                  lVar22 = lVar20 * uVar1 + local_2b8._24_8_;
                  uVar24 = *(undefined4 *)(lVar22 + 4 + lVar26 * 4);
                  lVar13 = lVar13 * uVar16 + local_240;
                  piVar2 = (int *)(lVar13 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar20 = lVar20 * uVar16 + local_2b8._24_8_;
                  *(undefined4 *)(lVar20 + lVar26 * 4) = uVar24;
                  iVar21 = 5;
                  if ((lVar26 != 0) &&
                     (piVar2 = (int *)(lVar25 + -4 + lVar26 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar18 + -1 + lVar26) != '\0')) {
                    piVar2 = (int *)(lVar13 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar10 = *(uint *)(lVar20 + lVar26 * 4);
                    piVar2 = (int *)(lVar17 + -4 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    TTA::MemMerge(uVar10,*(uint *)(lVar22 + -4 + lVar26 * 4));
                  }
                }
                else {
                  lVar13 = *local_208;
                  piVar2 = (int *)(lVar13 * uVar1 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar20 = *(long *)local_2b8._80_8_;
                  uVar24 = *(undefined4 *)(lVar20 * uVar1 + local_2b8._24_8_ + lVar26 * 4);
                  piVar2 = (int *)(lVar13 * uVar16 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  *(undefined4 *)(lVar20 * uVar16 + local_2b8._24_8_ + lVar26 * 4) = uVar24;
                  iVar21 = 4;
                }
              }
              uVar24 = 2;
              if ((uVar15 < uVar23) &&
                 (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) != '\0'))
              {
                lVar13 = *local_208;
                piVar2 = (int *)(lVar13 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar20 = *(long *)local_2b8._80_8_;
                uVar10 = *(uint *)(lVar20 * uVar16 + local_2b8._24_8_ + lVar26 * 4);
                piVar2 = (int *)(lVar13 * uVar15 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = lVar20 * uVar15 + local_2b8._24_8_;
                goto LAB_001ae0b7;
              }
            }
            break;
          case 2:
            lVar13 = *local_138;
            piVar2 = (int *)(lVar13 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar20 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar26 + lVar20 * uVar16 + local_1e8._24_8_) == '\0') goto LAB_001ad2ea;
            uVar24 = 2;
            if (iVar21 == 6) {
LAB_001ad8fd:
              lVar25 = *local_208;
              lVar17 = lVar25 * uVar16 + local_240;
              piVar2 = (int *)(lVar17 + -4 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar18 = *(long *)local_2b8._80_8_;
              lVar22 = lVar18 * uVar16 + local_2b8._24_8_;
              uVar5 = *(undefined4 *)(lVar22 + -4 + lVar26 * 4);
              piVar2 = (int *)(lVar17 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar22 + lVar26 * 4) = uVar5;
              iVar21 = 6;
              if (((uVar16 != 0) && (local_1f0 = local_240, lVar26 + 1 < lVar19)) &&
                 (piVar2 = (int *)(local_170 + lVar13 * uVar1 + 4 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + 1 + local_1e8._24_8_ + lVar20 * uVar1) != '\0')) {
                piVar2 = (int *)(lVar17 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar10 = *(uint *)(lVar22 + lVar26 * 4);
                piVar2 = (int *)(local_240 + lVar25 * uVar1 + 4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
LAB_001ad9b2:
                local_1f0 = local_240;
                TTA::MemMerge(uVar10,*(uint *)(local_2b8._24_8_ + lVar18 * uVar1 + 4 + lVar26 * 4));
                iVar21 = 5;
              }
            }
            else if (iVar21 == 5) {
LAB_001ad5da:
              lVar13 = *local_208 * uVar16 + local_240;
              piVar2 = (int *)(lVar13 + -4 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar20 = *(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_;
              uVar24 = *(undefined4 *)(lVar20 + -4 + lVar26 * 4);
              piVar2 = (int *)(lVar13 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar20 + lVar26 * 4) = uVar24;
              iVar21 = 5;
              uVar24 = 5;
            }
            else if (iVar21 == 4) {
              lVar25 = *local_208;
              lVar17 = lVar25 * uVar16 + local_240;
              piVar2 = (int *)(lVar17 + -4 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar18 = *(long *)local_2b8._80_8_;
              lVar22 = lVar18 * uVar16 + local_2b8._24_8_;
              uVar24 = *(undefined4 *)(lVar22 + -4 + lVar26 * 4);
              piVar2 = (int *)(lVar17 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar22 + lVar26 * 4) = uVar24;
              uVar24 = 4;
              iVar21 = 6;
              if (uVar16 != 0) {
                local_1f0 = local_240;
                lVar12 = local_170 + lVar13 * uVar1;
                piVar2 = (int *)(lVar12 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = local_1e8._24_8_ + lVar20 * uVar1;
                bVar27 = *(char *)(lVar26 + lVar13) == '\0';
                if (bVar27) {
                  if ((lVar26 + 1 < lVar19) &&
                     (piVar2 = (int *)(lVar12 + 4 + lVar26 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar13 + 1 + lVar26) != '\0')) {
                    piVar2 = (int *)(lVar17 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar10 = *(uint *)(lVar22 + lVar26 * 4);
                    piVar2 = (int *)(local_240 + lVar25 * uVar1 + 4 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    goto LAB_001ad9b2;
                  }
                }
                else {
LAB_001ad2da:
                  local_1f0 = local_240;
                  uVar24 = 4;
                  iVar21 = (uint)bVar27 * 2 + 4;
                }
              }
            }
LAB_001ae932:
            if ((uVar15 < uVar23) &&
               (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) != '\0')) {
              lVar13 = *local_208;
              piVar2 = (int *)(lVar13 * uVar16 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar20 = *(long *)local_2b8._80_8_;
              uVar10 = *(uint *)(lVar20 * uVar16 + local_2b8._24_8_ + lVar26 * 4);
              piVar2 = (int *)(lVar13 * uVar15 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar13 = lVar20 * uVar15 + local_2b8._24_8_;
              goto LAB_001ae9c2;
            }
            break;
          case 3:
            lVar13 = *local_138;
            piVar2 = (int *)(lVar13 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar20 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar26 + lVar20 * uVar16 + local_1e8._24_8_) != '\0') {
              if (uVar16 == 0) {
LAB_001ae337:
                lVar25 = *local_208;
                piVar2 = (int *)(lVar25 * uVar15 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar18 = *(long *)local_2b8._80_8_;
                uVar24 = *(undefined4 *)(lVar18 * uVar15 + local_2b8._24_8_ + -4 + lVar26 * 4);
                lVar17 = lVar25 * uVar16 + local_240;
                piVar2 = (int *)(lVar17 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar22 = lVar18 * uVar16 + local_2b8._24_8_;
                *(undefined4 *)(lVar22 + lVar26 * 4) = uVar24;
                iVar21 = 6;
                if ((lVar26 != 0 && uVar16 != 0) &&
                   (piVar2 = (int *)(local_170 + lVar13 * uVar1 + -4 + lVar26 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar26 + -1 + local_1e8._24_8_ + lVar20 * uVar1) != '\0')) {
                  piVar2 = (int *)(lVar17 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar10 = *(uint *)(lVar22 + lVar26 * 4);
                  piVar2 = (int *)(local_240 + lVar25 * uVar1 + -4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar11 = (uint *)(local_2b8._24_8_ + lVar18 * uVar1 + (lVar26 + -1) * 4);
LAB_001ae3fe:
                  TTA::MemMerge(uVar10,*puVar11);
                }
              }
              else {
                lVar25 = lVar13 * uVar1 + local_170;
                piVar2 = (int *)(lVar25 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar18 = lVar20 * uVar1 + local_1e8._24_8_;
                if (*(char *)(lVar26 + lVar18) != '\0') {
                  lVar13 = *local_208;
                  piVar2 = (int *)(lVar13 * uVar1 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar20 = *(long *)local_2b8._80_8_;
                  uVar24 = *(undefined4 *)(lVar20 * uVar1 + local_2b8._24_8_ + lVar26 * 4);
                  lVar25 = lVar13 * uVar16 + local_240;
                  piVar2 = (int *)(lVar25 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar18 = lVar20 * uVar16 + local_2b8._24_8_;
                  *(undefined4 *)(lVar18 + lVar26 * 4) = uVar24;
                  piVar2 = (int *)(lVar25 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar10 = *(uint *)(lVar18 + lVar26 * 4);
                  piVar2 = (int *)(lVar13 * uVar15 + local_240 + -4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar11 = (uint *)(lVar20 * uVar15 + local_2b8._24_8_ + lVar26 * 4 + -4);
                  iVar21 = 4;
                  goto LAB_001ae3fe;
                }
                if ((lVar19 <= lVar26 + 1) ||
                   (piVar2 = (int *)(lVar25 + 4 + lVar26 * 4), *piVar2 = *piVar2 + 1,
                   *(char *)(lVar18 + 1 + lVar26) == '\0')) goto LAB_001ae337;
                lVar13 = *local_208;
                piVar2 = (int *)(lVar13 * uVar1 + local_240 + 4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar20 = *(long *)local_2b8._80_8_;
                uVar24 = *(undefined4 *)(lVar20 * uVar1 + local_2b8._24_8_ + 4 + lVar26 * 4);
                lVar25 = lVar13 * uVar16 + local_240;
                piVar2 = (int *)(lVar25 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar18 = lVar20 * uVar16 + local_2b8._24_8_;
                *(undefined4 *)(lVar18 + lVar26 * 4) = uVar24;
                piVar2 = (int *)(lVar25 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar10 = *(uint *)(lVar18 + lVar26 * 4);
                piVar2 = (int *)(lVar13 * uVar15 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                TTA::MemMerge(uVar10,*(uint *)(lVar20 * uVar15 + local_2b8._24_8_ + -4 + lVar26 * 4)
                             );
                iVar21 = 5;
                if ((lVar26 != 0) &&
                   (piVar2 = (int *)(*local_138 * uVar1 + local_170 + -4 + lVar26 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar26 + -1 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) !=
                   '\0')) {
                  lVar13 = *local_208;
                  piVar2 = (int *)(lVar13 * uVar16 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar20 = *(long *)local_2b8._80_8_;
                  uVar10 = *(uint *)(lVar20 * uVar16 + local_2b8._24_8_ + lVar26 * 4);
                  piVar2 = (int *)(lVar13 * uVar1 + local_240 + -4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar11 = (uint *)(lVar20 * uVar1 + local_2b8._24_8_ + (lVar26 + -1) * 4);
                  goto LAB_001ae3fe;
                }
              }
              uVar24 = 8;
              if ((uVar23 <= uVar15) ||
                 (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) == '\0'))
              break;
              lVar13 = *local_208;
              piVar2 = (int *)(lVar13 * uVar16 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar20 = *(long *)local_2b8._80_8_;
              uVar10 = *(uint *)(lVar20 * uVar16 + local_2b8._24_8_ + lVar26 * 4);
              piVar2 = (int *)(lVar13 * uVar15 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar13 = lVar20 * uVar15 + local_2b8._24_8_;
LAB_001ae7f8:
              uVar24 = 8;
              goto LAB_001ae9c2;
            }
LAB_001ad573:
            uVar24 = 1;
            if ((uVar15 < uVar23) &&
               (piVar2 = (int *)(local_170 + lVar13 * uVar15 + lVar26 * 4), *piVar2 = *piVar2 + 1,
               *(char *)(lVar26 + local_1e8._24_8_ + lVar20 * uVar15) != '\0')) {
              lVar20 = *local_208 * uVar15 + local_240;
              piVar2 = (int *)(lVar20 + -4 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar13 = *(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_;
              uVar10 = *(uint *)(lVar13 + -4 + lVar26 * 4);
              piVar2 = (int *)(lVar20 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              goto LAB_001ad83d;
            }
            break;
          case 4:
            lVar13 = *local_138;
            piVar2 = (int *)(lVar13 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar20 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar26 + lVar20 * uVar16 + local_1e8._24_8_) != '\0') {
              uVar24 = 4;
              if (iVar21 == 6) goto LAB_001ad8fd;
              if (iVar21 == 5) goto LAB_001ad5da;
              if (iVar21 == 4) {
                lVar25 = *local_208;
                lVar17 = lVar25 * uVar16 + local_240;
                piVar2 = (int *)(lVar17 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar18 = *(long *)local_2b8._80_8_;
                lVar22 = lVar18 * uVar16 + local_2b8._24_8_;
                uVar5 = *(undefined4 *)(lVar22 + -4 + lVar26 * 4);
                piVar2 = (int *)(lVar17 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(lVar22 + lVar26 * 4) = uVar5;
                iVar21 = 6;
                if (uVar16 != 0) {
                  local_1f0 = local_240;
                  lVar12 = local_170 + lVar13 * uVar1;
                  piVar2 = (int *)(lVar12 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar13 = local_1e8._24_8_ + lVar20 * uVar1;
                  bVar27 = *(char *)(lVar26 + lVar13) == '\0';
                  if (!bVar27) goto LAB_001ad2da;
                  if ((lVar26 + 1 < lVar19) &&
                     (piVar2 = (int *)(lVar12 + 4 + lVar26 * 4), *piVar2 = *piVar2 + 1,
                     *(char *)(lVar13 + 1 + lVar26) != '\0')) {
                    piVar2 = (int *)(lVar17 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar10 = *(uint *)(lVar22 + lVar26 * 4);
                    piVar2 = (int *)(local_240 + lVar25 * uVar1 + 4 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    goto LAB_001ad9b2;
                  }
                }
              }
              goto LAB_001ae932;
            }
            goto LAB_001ad2ea;
          case 5:
            lVar13 = *local_138;
            piVar2 = (int *)(lVar13 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar20 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar26 + lVar20 * uVar16 + local_1e8._24_8_) != '\0') {
              lVar25 = *local_208;
              lVar17 = lVar25 * uVar16 + local_240;
              piVar2 = (int *)(lVar17 + -4 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar18 = *(long *)local_2b8._80_8_;
              lVar22 = lVar18 * uVar16 + local_2b8._24_8_;
              uVar24 = *(undefined4 *)(lVar22 + -4 + lVar26 * 4);
              piVar2 = (int *)(lVar17 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(lVar22 + lVar26 * 4) = uVar24;
              iVar21 = 6;
              if (uVar16 != 0) {
                lVar13 = local_170 + lVar13 * uVar1;
                piVar2 = (int *)(lVar13 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar20 = local_1e8._24_8_ + lVar20 * uVar1;
                bVar27 = *(char *)(lVar26 + lVar20) == '\0';
                if (bVar27) {
                  if (lVar26 + 1 < lVar19) {
                    piVar2 = (int *)(lVar13 + 4 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    iVar21 = 6;
                    if (*(char *)(lVar20 + 1 + lVar26) != '\0') {
                      piVar2 = (int *)(lVar17 + lVar26 * 4);
                      *piVar2 = *piVar2 + 1;
                      uVar10 = *(uint *)(lVar22 + lVar26 * 4);
                      piVar2 = (int *)(local_240 + lVar25 * uVar1 + 4 + lVar26 * 4);
                      *piVar2 = *piVar2 + 1;
                      TTA::MemMerge(uVar10,*(uint *)(local_2b8._24_8_ + lVar18 * uVar1 + 4 +
                                                    lVar26 * 4));
                      iVar21 = 5;
                    }
                  }
                  else {
                    iVar21 = 6;
                  }
                }
                else {
                  iVar21 = (uint)bVar27 * 2 + 4;
                }
              }
              uVar24 = 4;
              if ((uVar15 < uVar23) &&
                 (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) != '\0'))
              {
                lVar13 = *local_208;
                piVar2 = (int *)(lVar13 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar20 = *(long *)local_2b8._80_8_;
                uVar10 = *(uint *)(lVar20 * uVar16 + local_2b8._24_8_ + lVar26 * 4);
                piVar2 = (int *)(lVar13 * uVar15 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = lVar20 * uVar15 + local_2b8._24_8_;
                uVar24 = 4;
                goto LAB_001ae9c2;
              }
              break;
            }
            uVar24 = 1;
            if (uVar23 <= uVar15) break;
            piVar2 = (int *)(local_170 + lVar13 * uVar15 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            cVar3 = *(char *)(lVar26 + local_1e8._24_8_ + lVar20 * uVar15);
            goto joined_r0x001ad64b;
          case 6:
            lVar13 = *local_138;
            piVar2 = (int *)(lVar13 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar20 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar26 + lVar20 * uVar16 + local_1e8._24_8_) != '\0') {
              if (iVar21 == 6) {
                lVar25 = *local_208;
                lVar17 = lVar25 * uVar16 + local_240;
                piVar2 = (int *)(lVar17 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar18 = *(long *)local_2b8._80_8_;
                lVar22 = lVar18 * uVar16 + local_2b8._24_8_;
                uVar24 = *(undefined4 *)(lVar22 + -4 + lVar26 * 4);
                piVar2 = (int *)(lVar17 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(lVar22 + lVar26 * 4) = uVar24;
                uVar24 = 6;
                if (uVar16 == 0) {
                  iVar21 = 6;
                }
                else if (lVar26 + 1 < lVar19) {
                  piVar2 = (int *)(local_170 + lVar13 * uVar1 + 4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  if (*(char *)(lVar26 + 1 + local_1e8._24_8_ + lVar20 * uVar1) == '\0') {
                    iVar21 = 6;
                  }
                  else {
                    piVar2 = (int *)(lVar17 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar10 = *(uint *)(lVar22 + lVar26 * 4);
                    piVar2 = (int *)(local_240 + lVar25 * uVar1 + 4 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    TTA::MemMerge(uVar10,*(uint *)(local_2b8._24_8_ + lVar18 * uVar1 + 4 +
                                                  lVar26 * 4));
                    iVar21 = 5;
                  }
                }
                else {
                  iVar21 = 6;
                }
              }
              else {
                uVar24 = 6;
                if (iVar21 == 5) goto LAB_001ad5da;
              }
              goto LAB_001ae932;
            }
LAB_001ad2ea:
            uVar24 = 1;
            if (uVar15 < uVar23) {
              piVar2 = (int *)(local_170 + lVar13 * uVar15 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              cVar3 = *(char *)(lVar26 + local_1e8._24_8_ + lVar20 * uVar15);
joined_r0x001ad64b:
              uVar24 = 1;
              if (cVar3 != '\0') {
                lVar13 = *local_208;
                piVar2 = (int *)(lVar13 * uVar16 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar20 = *(long *)local_2b8._80_8_;
                uVar10 = *(uint *)(lVar20 * uVar16 + local_2b8._24_8_ + -4 + lVar26 * 4);
                piVar2 = (int *)(lVar13 * uVar15 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = lVar20 * uVar15 + local_2b8._24_8_;
LAB_001ad8f2:
                uVar24 = 7;
LAB_001ae9c2:
                *(uint *)(lVar13 + lVar26 * 4) = uVar10;
              }
            }
            break;
          case 7:
            lVar13 = *local_138;
            piVar2 = (int *)(lVar13 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar20 = *(long *)local_1e8._80_8_;
            if (*(char *)(lVar26 + lVar20 * uVar16 + local_1e8._24_8_) == '\0') goto LAB_001ad573;
            if (uVar16 != 0) {
              piVar2 = (int *)(*local_138 * uVar1 + local_170 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              if (*(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) != '\0')
              {
                piVar2 = (int *)(*local_208 * uVar1 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *(long *)local_2b8._80_8_;
LAB_001ad3d2:
                uVar24 = *(undefined4 *)(lVar13 * uVar1 + local_2b8._24_8_ + lVar26 * 4);
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
                     = uVar24;
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                puVar11 = (uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ +
                                  lVar26 * 4);
                iVar21 = 4;
                uVar14 = uVar15;
                goto LAB_001ae712;
              }
              if ((lVar26 + 1 < lVar19) &&
                 (piVar2 = (int *)(*local_138 * uVar1 + local_170 + 4 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + 1 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) !=
                 '\0')) {
                lVar13 = *local_208;
LAB_001ae507:
                piVar2 = (int *)(lVar13 * uVar1 + local_240 + 4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar24 = *(undefined4 *)
                          (*(long *)local_2b8._80_8_ * uVar1 + local_2b8._24_8_ + 4 + lVar26 * 4);
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
                     = uVar24;
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ +
                                  lVar26 * 4);
                piVar2 = (int *)(*local_208 * uVar15 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                TTA::MemMerge(uVar10,*(uint *)(*(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_
                                               + -4 + lVar26 * 4));
                iVar21 = 5;
                if (lVar26 != 0) {
                  piVar2 = (int *)(*local_138 * uVar1 + local_170 + -4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  cVar3 = *(char *)(lVar26 + -1 +
                                   *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_);
                  goto joined_r0x001ae6d9;
                }
                goto LAB_001ae750;
              }
            }
            lVar25 = *local_208;
            piVar2 = (int *)(lVar25 * uVar15 + local_240 + -4 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar18 = *(long *)local_2b8._80_8_;
            uVar24 = *(undefined4 *)(lVar18 * uVar15 + local_2b8._24_8_ + -4 + lVar26 * 4);
            lVar25 = lVar25 * uVar16 + local_240;
            piVar2 = (int *)(lVar25 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            *(undefined4 *)(lVar18 * uVar16 + local_2b8._24_8_ + lVar26 * 4) = uVar24;
            iVar21 = 6;
            if ((lVar26 != 0 && uVar16 != 0) &&
               (piVar2 = (int *)(local_170 + lVar13 * uVar1 + -4 + lVar26 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar26 + -1 + local_1e8._24_8_ + lVar20 * uVar1) != '\0')) {
              piVar2 = (int *)(lVar25 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              puVar11 = (uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
              ;
LAB_001ae712:
              uVar10 = *puVar11;
              piVar2 = (int *)(*local_208 * uVar14 + local_240 + (lVar26 + -1) * 4);
              *piVar2 = *piVar2 + 1;
              TTA::MemMerge(uVar10,*(uint *)(uVar14 * *(long *)local_2b8._80_8_ + local_2b8._24_8_ +
                                            (lVar26 + -1) * 4));
            }
LAB_001ae750:
            uVar24 = 8;
            if ((uVar15 < uVar23) &&
               (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) != '\0')) {
              piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
              ;
              piVar2 = (int *)(*local_208 * uVar15 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar13 = *(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_;
              goto LAB_001ae7f8;
            }
            break;
          case 8:
            piVar2 = (int *)(*local_138 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            if (*(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar16 + local_1e8._24_8_) == '\0') {
              uVar24 = 1;
              if ((uVar15 < uVar23) &&
                 (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) != '\0'))
              {
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *local_208 * uVar15 + local_240;
                uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + -4 +
                                  lVar26 * 4);
                goto LAB_001ad8dd;
              }
            }
            else {
              uVar24 = 8;
              if (iVar21 == 6) {
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar5 = *(undefined4 *)
                         (*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + -4 + lVar26 * 4);
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
                     = uVar5;
                iVar21 = 6;
                if (uVar16 != 0) {
LAB_001adb63:
                  iVar21 = 6;
                  if ((lVar26 + 1 < lVar19) &&
                     (piVar2 = (int *)(*local_138 * uVar1 + local_170 + 4 + lVar26 * 4),
                     *piVar2 = *piVar2 + 1,
                     *(char *)(lVar26 + 1 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) !=
                     '\0')) {
                    piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ +
                                      lVar26 * 4);
                    piVar2 = (int *)(*local_208 * uVar1 + local_240 + 4 + lVar26 * 4);
                    *piVar2 = *piVar2 + 1;
                    TTA::MemMerge(uVar10,*(uint *)(*(long *)local_2b8._80_8_ * uVar1 +
                                                   local_2b8._24_8_ + 4 + lVar26 * 4));
                    iVar21 = 5;
                  }
                }
              }
              else if (iVar21 == 5) {
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar24 = *(undefined4 *)
                          (*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + -4 + lVar26 * 4);
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
                     = uVar24;
                iVar21 = 5;
                uVar24 = 5;
              }
              else if (iVar21 == 4) {
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar24 = *(undefined4 *)
                          (*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + -4 + lVar26 * 4);
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                *(undefined4 *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
                     = uVar24;
                uVar24 = 4;
                iVar21 = 6;
                if (uVar16 != 0) {
                  piVar2 = (int *)(*local_138 * uVar1 + local_170 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  bVar27 = *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_)
                           == '\0';
                  if (bVar27) goto LAB_001adb63;
                  iVar21 = (uint)bVar27 * 2 + 4;
                }
              }
              if ((uVar15 < uVar23) &&
                 (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) != '\0'))
              {
                piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ +
                                  lVar26 * 4);
                piVar2 = (int *)(*local_208 * uVar15 + local_240 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                lVar13 = *(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_;
                goto LAB_001ae9c2;
              }
            }
            break;
          case 9:
            piVar2 = (int *)(*local_138 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            if (*(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar16 + local_1e8._24_8_) != '\0') {
              if (uVar16 != 0) {
                piVar2 = (int *)(*local_138 * uVar1 + local_170 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                if (*(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) != '\0'
                   ) {
                  piVar2 = (int *)(*local_208 * uVar1 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  lVar13 = *(long *)local_2b8._80_8_;
                  goto LAB_001ad3d2;
                }
                if ((lVar26 + 1 < lVar19) &&
                   (piVar2 = (int *)(*local_138 * uVar1 + local_170 + 4 + lVar26 * 4),
                   *piVar2 = *piVar2 + 1,
                   *(char *)(lVar26 + 1 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) !=
                   '\0')) {
                  lVar13 = *local_208;
                  goto LAB_001ae507;
                }
              }
              piVar2 = (int *)(*local_208 * uVar15 + local_240 + -4 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              uVar24 = *(undefined4 *)
                        (*(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_ + -4 + lVar26 * 4);
              piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              *(undefined4 *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4) =
                   uVar24;
              iVar21 = 6;
              if (lVar26 != 0 && uVar16 != 0) {
                piVar2 = (int *)(*local_138 * uVar1 + local_170 + -4 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                cVar3 = *(char *)(lVar26 + -1 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_
                                 );
joined_r0x001ae6d9:
                if (cVar3 != '\0') {
                  piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  puVar11 = (uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ +
                                    lVar26 * 4);
                  goto LAB_001ae712;
                }
              }
              goto LAB_001ae750;
            }
            uVar24 = 1;
            if ((uVar23 <= uVar15) ||
               (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) == '\0'))
            break;
            piVar2 = (int *)(*local_208 * uVar15 + local_240 + -4 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_ + -4 +
                              lVar26 * 4);
            piVar2 = (int *)(*local_208 * uVar15 + local_240 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar13 = *(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_;
LAB_001ad83d:
            uVar24 = 9;
            goto LAB_001ae9c2;
          case 0xffffffff:
            piVar2 = (int *)(*local_138 * uVar16 + local_170 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            if (*(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar16 + local_1e8._24_8_) != '\0') {
              if (uVar16 == 0) {
LAB_001addac:
                iVar21 = 6;
                uVar10 = TTA::MemNewLabel();
              }
              else {
                piVar2 = (int *)(*local_138 * uVar1 + local_170 + lVar26 * 4);
                *piVar2 = *piVar2 + 1;
                if (*(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) == '\0'
                   ) {
                  if ((lVar19 <= lVar26 + 1) ||
                     (piVar2 = (int *)(*local_138 * uVar1 + local_170 + 4 + lVar26 * 4),
                     *piVar2 = *piVar2 + 1,
                     *(char *)(lVar26 + 1 + *(long *)local_1e8._80_8_ * uVar1 + local_1e8._24_8_) ==
                     '\0')) goto LAB_001addac;
                  piVar2 = (int *)(*local_208 * uVar1 + local_240 + 4 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar1 + local_2b8._24_8_ + 4 +
                                    lVar26 * 4);
                  iVar21 = 5;
                }
                else {
                  piVar2 = (int *)(*local_208 * uVar1 + local_240 + lVar26 * 4);
                  *piVar2 = *piVar2 + 1;
                  uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar1 + local_2b8._24_8_ +
                                    lVar26 * 4);
                  iVar21 = 4;
                }
              }
              piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4) = uVar10
              ;
              uVar24 = 2;
              if ((uVar23 <= uVar15) ||
                 (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
                 *piVar2 = *piVar2 + 1,
                 *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) == '\0'))
              break;
              piVar2 = (int *)(*local_208 * uVar16 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              uVar10 = *(uint *)(*(long *)local_2b8._80_8_ * uVar16 + local_2b8._24_8_ + lVar26 * 4)
              ;
              piVar2 = (int *)(*local_208 * uVar15 + local_240 + lVar26 * 4);
              *piVar2 = *piVar2 + 1;
              lVar13 = *(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_;
LAB_001ae0b7:
              uVar24 = 2;
              goto LAB_001ae9c2;
            }
            uVar24 = 1;
            if ((uVar23 <= uVar15) ||
               (piVar2 = (int *)(*local_138 * uVar15 + local_170 + lVar26 * 4),
               *piVar2 = *piVar2 + 1,
               *(char *)(lVar26 + *(long *)local_1e8._80_8_ * uVar15 + local_1e8._24_8_) == '\0'))
            break;
            uVar10 = TTA::MemNewLabel();
            lVar13 = *local_208 * uVar15 + local_240;
LAB_001ad8dd:
            piVar2 = (int *)(lVar13 + lVar26 * 4);
            *piVar2 = *piVar2 + 1;
            lVar13 = *(long *)local_2b8._80_8_ * uVar15 + local_2b8._24_8_;
            goto LAB_001ad8f2;
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != lVar19);
      }
      uVar16 = uVar16 + 2;
    } while (uVar16 < uVar23);
  }
  uVar10 = TTA::MemFlatten();
  (local_120->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  piVar8 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)local_2b8._0_4_) {
    lVar19 = 0;
    do {
      if (0 < (int)local_2b8._4_4_) {
        lVar26 = *local_208;
        lVar20 = *(long *)local_2b8._80_8_ * lVar19 + local_2b8._24_8_;
        lVar13 = *local_208;
        lVar25 = 0;
        do {
          piVar2 = (int *)(lVar13 * lVar19 + local_240 + lVar25 * 4);
          *piVar2 = *piVar2 + 1;
          iVar4 = *(int *)(lVar20 + lVar25 * 4);
          piVar8[iVar4] = piVar8[iVar4] + 1;
          uVar10 = puVar7[iVar4];
          piVar2 = (int *)(lVar26 * lVar19 + local_240 + lVar25 * 4);
          *piVar2 = *piVar2 + 1;
          *(uint *)(lVar20 + lVar25 * 4) = uVar10;
          lVar25 = lVar25 + 1;
        } while (lVar25 < (int)local_2b8._4_4_);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (int)local_2b8._0_4_);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar9 = local_118;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_118,local_108);
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_180;
  cv::sum((_InputArray *)local_108);
  *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_250;
  cv::sum((_InputArray *)local_108);
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_108 >> 0x3f & (long)((double)local_108 - 9.223372036854776e+18) |
       (long)(double)local_108;
  dVar28 = TTA::MemTotalAccesses();
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar28 >> 0x3f & (long)(dVar28 - 9.223372036854776e+18) | (long)dVar28;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_2b8);
  cv::Mat::operator=(&((local_120->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_250);
  cv::Mat::~Mat((Mat *)(local_2b8 + 8));
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat((Mat *)(local_1e8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img(r,c)>0
#define CONDITION_B r+1<h && img(r + 1, c)>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img(r - 1, c - 1)>0
#define CONDITION_N2 r-1>=0 && img(r - 1, c)>0
#define CONDITION_N3 r-1>=0 && c+1<w && img(r - 1, c + 1)>0
#define CONDITION_N4 c-1>=0 && img(r, c - 1)>0
#define CONDITION_N5 c-1>=0 && r+1<h && img(r + 1, c - 1)>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // a <- n1
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // a <- n2
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // a <- n3
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // a <- n4
#define ACTION_7 img_labels(r, c) = img_labels(r + 1, c - 1); // a <- n5
#define ACTION_8 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c - 1)); // a + n1
#define ACTION_9 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c + 1)); // a + n3
#define ACTION_10 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r + 1, c - 1)); // a + n5
#define ACTION_11 img_labels(r + 1, c) = LabelsSolver::MemNewLabel(); // b new label
#define ACTION_12 img_labels(r + 1, c) = img_labels(r, c - 1); // b <- n4
#define ACTION_13 img_labels(r + 1, c) = img_labels(r + 1, c - 1); // b <- n5
#define ACTION_14 img_labels(r + 1, c) = img_labels(r, c); // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i,c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
    }